

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UgridReader.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
Parfait::UgridReader::readBoundaryTags
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *filename,int begin,
          int end,bool swapBytes)

{
  FILE *__stream;
  domain_error *this;
  long lVar1;
  size_type __n;
  bool bVar2;
  allocator_type local_8d;
  int nquad;
  int ntri;
  int nnodes;
  int nhex;
  int nprism;
  int npyr;
  int ntet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)filename);
  readHeader(&local_50,&nnodes,&ntri,&nquad,&ntet,&npyr,&nprism,&nhex,swapBytes);
  std::__cxx11::string::~string((string *)&local_50);
  __n = (size_type)(end - begin);
  local_70._M_dataplus._M_p._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict2 *)&local_70,&local_8d);
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,(long)nnodes * 0x18 + ((long)begin + (long)ntri * 3 + (long)nquad * 4) * 4 + 0x1c
          ,0);
    fread((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start,4,__n,__stream);
    fclose(__stream);
    if (swapBytes) {
      lVar1 = 0;
      while (bVar2 = __n != 0, __n = __n - 1, bVar2) {
        bswap_32((void *)((long)(__return_storage_ptr__->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar1));
        lVar1 = lVar1 + 4;
      }
    }
    return __return_storage_ptr__;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_70,"Could not open .ugrid file: ",filename);
  std::domain_error::domain_error(this,(string *)&local_70);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline std::vector<int> Parfait::UgridReader::readBoundaryTags(std::string filename,int begin,int end,bool swapBytes) {
    int nnodes,ntri,nquad,ntet,npyr,nprism,nhex;
    // get header info and allocate space for triangles
    readHeader(filename,nnodes,ntri,nquad,ntet,npyr,nprism,nhex,swapBytes);
    int nrequested = end - begin;
    std::vector<int> tags(nrequested,0);

    FILE *f = fopen(filename.c_str(),"rb");
    if(f == NULL){
        throw std::domain_error("Could not open .ugrid file: "+filename);
    }
    unsigned long int byteOffset = 7*sizeof(int) + 3*nnodes*sizeof(double);
    byteOffset += 3*ntri*sizeof(int);
    byteOffset += 4*nquad*sizeof(int);
    byteOffset += begin*sizeof(int);
    fseek(f,byteOffset,SEEK_SET);
    fread(&tags[0],sizeof(int),nrequested,f);
    fclose(f);
    if(swapBytes) {
        for (size_t i = 0; i < nrequested; i++) {
            bswap_32(&tags[i]);
        }
    }
    return tags;
}